

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TikzPlotter.cpp
# Opt level: O2

void __thiscall
vectorgraphics::TikzPlotter::addLineSegment(TikzPlotter *this,LineSegment2D *line_segment_2d)

{
  _Rb_tree_header *p_Var1;
  pointer psVar2;
  Style *this_00;
  TikzPlotter *this_01;
  bool bVar3;
  iterator iVar4;
  ostream *poVar5;
  pointer psVar6;
  long lVar7;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator<char> local_1c9;
  allocator<char> local_1c8;
  allocator_type local_1c7;
  allocator<char> local_1c6;
  allocator<char> local_1c5;
  allocator<char> local_1c4;
  allocator<char> local_1c3;
  allocator<char> local_1c2;
  allocator<char> local_1c1;
  LineSegment2D *local_1c0;
  TikzPlotter *local_1b8;
  key_type local_1b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_190;
  StyleMap style_map;
  vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
  local_148;
  key_type local_130;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &style_map._M_t._M_impl.super__Rb_tree_header._M_header;
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  style_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar2 = (line_segment_2d->super_Primitive).style_ptrs.
           super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = line_segment_2d;
  local_1b8 = this;
  style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       style_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (psVar6 = (line_segment_2d->super_Primitive).style_ptrs.
                super__Vector_base<std::shared_ptr<vectorgraphics::Style>,_std::allocator<std::shared_ptr<vectorgraphics::Style>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar2; psVar6 = psVar6 + 1) {
    this_00 = (psVar6->super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::
    vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
    ::vector(&local_148,
             (vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
              *)local_1c0);
    bVar3 = Style::conditionFulfilled(this_00,&local_148);
    std::
    vector<std::shared_ptr<vectorgraphics::Flag>,_std::allocator<std::shared_ptr<vectorgraphics::Flag>_>_>
    ::~vector(&local_148);
    if (bVar3) {
      Style::applyStyle((psVar6->
                        super___shared_ptr<vectorgraphics::Style,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr,&style_map);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"draw",&local_1c8);
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&style_map._M_t,&local_130);
  this_01 = local_1b8;
  p_Var1 = &style_map._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"fill",&local_1c9);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&style_map._M_t,&local_1b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_130);
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) goto LAB_001055d9;
  }
  else {
    std::__cxx11::string::~string((string *)&local_130);
  }
  poVar5 = std::operator<<((ostream *)&this_01->field_0x10,"\\path[");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_130,"draw",&local_1c8);
  std::__cxx11::string::string<std::allocator<char>>(local_110,"draw opacity",&local_1c9);
  std::__cxx11::string::string<std::allocator<char>>(local_f0,"fill",&local_1c1);
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"fill opacity",&local_1c2);
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"line width",&local_1c3);
  std::__cxx11::string::string<std::allocator<char>>(local_90,"line cap",&local_1c4);
  std::__cxx11::string::string<std::allocator<char>>(local_70,"dash pattern",&local_1c5);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"*line_path",&local_1c6);
  __l._M_len = 8;
  __l._M_array = &local_130;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_190,__l,&local_1c7);
  getStyleMapString(&local_1b0,&style_map,&local_190);
  poVar5 = std::operator<<(poVar5,(string *)&local_1b0);
  poVar5 = std::operator<<(poVar5,"] ");
  poVar5 = operator<<(poVar5,(local_1c0->start_ptr_).
                             super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
  poVar5 = std::operator<<(poVar5," -- ");
  poVar5 = operator<<(poVar5,(local_1c0->end_ptr_).
                             super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr);
  poVar5 = std::operator<<(poVar5,";");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_190);
  lVar7 = 0xe0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_130._M_dataplus._M_p + lVar7));
    lVar7 = lVar7 + -0x20;
  } while (lVar7 != -0x20);
LAB_001055d9:
  addPoint(this_01,(local_1c0->start_ptr_).
                   super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  addPoint(this_01,(local_1c0->end_ptr_).
                   super___shared_ptr<vectorgraphics::Point2D,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&style_map._M_t);
  return;
}

Assistant:

void TikzPlotter::addLineSegment(const LineSegment2D &line_segment_2d) {
    // first add the line
    StyleMap style_map;

    // check which styles apply
    for(const auto& style_ptr : line_segment_2d.style_ptrs) {
      if(style_ptr->conditionFulfilled(line_segment_2d.flag_ptrs)) {
        style_ptr->applyStyle(style_map);
      }
    }

    // add the line based on style_map final state
    if(style_map.find("draw") != style_map.end() || style_map.find("fill") != style_map.end()) {
      content << R"(\path[)" 
        << getStyleMapString(style_map, {"draw", "draw opacity", "fill", "fill opacity", "line width", "line cap", "dash pattern", "*line_path"})
        << "] " 
        << *line_segment_2d.start_ptr_ 
        << " -- " 
        << *line_segment_2d.end_ptr_
        << ";"
        << std::endl;
    }

    // next add the endpoints
    addPoint(*line_segment_2d.start_ptr_);
    addPoint(*line_segment_2d.end_ptr_);
  }